

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountAggregate.cpp
# Opt level: O0

void __thiscall
CountAggregate::CountAggregate
          (CountAggregate *this,string *pathToFiles,shared_ptr<Launcher> *launcher)

{
  duration __lhs;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __rhs;
  rep rVar1;
  string *in_RSI;
  MachineLearningModel *in_RDI;
  int64_t endPrecompute;
  int64_t startPrecompute;
  Launcher *in_stack_fffffffffffffea8;
  FadeAggregates *in_stack_fffffffffffffeb0;
  MachineLearningModel *__val;
  string local_d8 [32];
  string local_b8 [8];
  CountAggregate *in_stack_ffffffffffffff50;
  string local_98 [32];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_78;
  rep local_70;
  duration<long,_std::ratio<1L,_1000L>_> local_68;
  long local_60;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_58;
  rep local_50;
  duration<long,_std::ratio<1L,_1000L>_> local_48;
  rep local_40;
  string *local_10;
  
  local_10 = in_RSI;
  MachineLearningModel::MachineLearningModel(in_RDI);
  in_RDI->_vptr_MachineLearningModel = (_func_int **)&PTR__CountAggregate_001f0af0;
  std::__cxx11::string::string((string *)(in_RDI + 1),local_10);
  std::shared_ptr<Launcher>::shared_ptr
            ((shared_ptr<Launcher> *)in_stack_fffffffffffffeb0,
             (shared_ptr<Launcher> *)in_stack_fffffffffffffea8);
  fade::FadeAggregates::FadeAggregates(in_stack_fffffffffffffeb0);
  in_RDI[0xe]._vptr_MachineLearningModel = (_func_int **)0x0;
  in_RDI[0xf]._vptr_MachineLearningModel = (_func_int **)0x0;
  std::shared_ptr<Fade>::shared_ptr((shared_ptr<Fade> *)0x197a2d);
  std::shared_ptr<DTree>::shared_ptr((shared_ptr<DTree> *)0x197a43);
  std::
  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  ::vector((vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
            *)0x197a59);
  __val = in_RDI + 0x19;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)0x197a6f);
  in_RDI[0x1e]._vptr_MachineLearningModel = (_func_int **)0x0;
  in_RDI[0x1f]._vptr_MachineLearningModel = (_func_int **)0x0;
  in_RDI[0x20]._vptr_MachineLearningModel = (_func_int **)0x0;
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x197a9f);
  Launcher::getDTree(in_stack_fffffffffffffea8);
  std::shared_ptr<DTree>::operator=
            ((shared_ptr<DTree> *)in_stack_fffffffffffffeb0,
             (shared_ptr<DTree> *)in_stack_fffffffffffffea8);
  std::shared_ptr<DTree>::~shared_ptr((shared_ptr<DTree> *)0x197ad9);
  local_58.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_50 = (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch(&local_58);
  local_48.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                 in_stack_fffffffffffffea8);
  local_40 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_48);
  createAggregateRegister(in_stack_ffffffffffffff50);
  local_78.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  __lhs = std::chrono::
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          ::time_since_epoch(&local_78);
  local_70 = __lhs.__r;
  __rhs = std::chrono::
          duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffea8);
  local_68.__r = __rhs.__r;
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_68);
  local_60 = rVar1 - local_40;
  std::__cxx11::to_string((long)__val);
  std::operator+((char *)__lhs.__r,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs.__r);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs.__r,
                 (char *)__rhs.__r);
  std::operator<<((ostream *)&std::cout,local_98);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  return;
}

Assistant:

CountAggregate::CountAggregate(
    const string& pathToFiles, shared_ptr<Launcher> launcher) :
    _pathToFiles(pathToFiles), _launcher(launcher)
{
    _dTree = launcher->getDTree();

#ifdef BENCH
    int64_t startPrecompute = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch()).count();
#endif

    /* creates the aggregate Register that is passed to FADE. */
    createAggregateRegister();
    
#ifdef BENCH
    int64_t endPrecompute = duration_cast<milliseconds>
        (system_clock::now().time_since_epoch()).count() - startPrecompute;    
#endif
    
    BINFO( "TIME - Count precomputation: "
           + to_string(endPrecompute) + "ms.\n");
}